

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int received_set_section_number(RECEIVED_HANDLE received,uint32_t section_number_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  RECEIVED_INSTANCE *received_instance;
  
  if (received == (RECEIVED_HANDLE)0x0) {
    iVar2 = 0x43fe;
  }
  else {
    item_value = amqpvalue_create_uint(section_number_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x4406;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(received->composite_value,0,item_value);
      iVar2 = 0x440c;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int received_set_section_number(RECEIVED_HANDLE received, uint32_t section_number_value)
{
    int result;

    if (received == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received;
        AMQP_VALUE section_number_amqp_value = amqpvalue_create_uint(section_number_value);
        if (section_number_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(received_instance->composite_value, 0, section_number_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(section_number_amqp_value);
        }
    }

    return result;
}